

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinuxFileSystem.cpp
# Opt level: O1

SearchFilesResult *
Diligent::LinuxFileSystem::SearchRecursive
          (SearchFilesResult *__return_storage_ptr__,Char *Dir,Char *SearchPattern)

{
  SearchRecursive<Diligent::LinuxFileSystem>(__return_storage_ptr__,Dir,SearchPattern);
  return __return_storage_ptr__;
}

Assistant:

LinuxFileSystem::SearchFilesResult LinuxFileSystem::SearchRecursive(const Char* Dir, const Char* SearchPattern)
{
#if PLATFORM_LINUX || PLATFORM_APPLE
    return Diligent::SearchRecursive<LinuxFileSystem>(Dir, SearchPattern);
#else
    UNSUPPORTED("Not implemented");
    return {};
#endif
}